

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ostream *this;
  runtime_error *this_00;
  char **in_RSI;
  int in_EDI;
  float fVar4;
  char *end_1;
  char *end;
  int opt;
  ProgramOptions po;
  ProgramOptions *in_stack_fffffffffffffeb0;
  ProgramOptions *in_stack_fffffffffffffed0;
  string *this_01;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  ProgramOptions *in_stack_ffffffffffffff70;
  char *local_88;
  int local_80;
  string local_70 [32];
  undefined1 local_50;
  undefined1 local_4f;
  string local_48 [32];
  undefined1 local_28;
  undefined4 local_24;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  float local_1c;
  undefined1 local_18;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ProgramOptions::ProgramOptions(in_stack_fffffffffffffed0);
  if (local_8 == 1) {
    ProgramOptions::usage((char **)0x122095);
  }
  while (local_80 = getopt(local_8,local_10,"hg:menfir:ac"), local_80 != -1) {
    switch(local_80) {
    case 0x3f:
      if ((_optopt == 0x67) || (_optopt == 0x72)) {
        this = std::operator<<((ostream *)&std::cerr,"Options -g and -r require an argument.");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        ProgramOptions::usage((char **)0x12227d);
      }
      break;
    default:
      ProgramOptions::usage((char **)0x122290);
      break;
    case 0x61:
      local_28 = 1;
      local_20 = 1;
      local_1f = 1;
      local_1d = 1;
      local_4f = 1;
      local_50 = 1;
      break;
    case 99:
      local_50 = 1;
      break;
    case 0x65:
      local_1f = 1;
      local_20 = 1;
      break;
    case 0x66:
      local_28 = 1;
      local_20 = 1;
      local_1f = 1;
      local_1d = 1;
      break;
    case 0x67:
      lVar3 = strtol(_optarg,&local_88,10);
      local_24 = (undefined4)lVar3;
      local_28 = 1;
      break;
    case 0x68:
      ProgramOptions::usage((char **)0x12211b);
      break;
    case 0x69:
      local_18 = 1;
      break;
    case 0x6d:
      local_20 = 1;
      break;
    case 0x6e:
      local_1e = 1;
      break;
    case 0x72:
      fVar4 = strtof(_optarg,(char **)&stack0xffffffffffffff70);
      local_1c = (float)((long)fVar4 & 0xffffffff);
      local_1d = 1;
    }
  }
  if (*local_10[local_8 + -1] == '-') {
    ProgramOptions::usage((char **)0x122424);
  }
  else {
    pcVar1 = local_10[local_8 + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    this_01 = local_b0;
    std::__cxx11::string::operator=(local_70,this_01);
    std::__cxx11::string::~string(this_01);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::find_last_of((char *)local_70,0x12510c);
    std::__cxx11::string::substr((ulong)local_d8,(ulong)local_70);
    std::__cxx11::string::operator=(local_48,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::find_last_of((char)local_48,0x2e);
    std::__cxx11::string::substr((ulong)local_f8,(ulong)local_48);
    std::__cxx11::string::operator=(local_48,local_f8);
    std::__cxx11::string::~string(local_f8);
  }
  iVar2 = system("mkdir -p output");
  if (iVar2 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Could not create output directory.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ProgramOptions::run(in_stack_ffffffffffffff70);
  local_4 = 0;
  ProgramOptions::~ProgramOptions(in_stack_fffffffffffffeb0);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hg:menfir:ac")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'c': {
        po.cuda = true;
        break;
      }

      case 'g': {
        char *end;
        po.water_opts.blur_size = (unsigned int) std::strtol(optarg, &end, 10);
        po.water_opts.blur = true;
        break;
      }

      case 'm':po.water_opts.histogram = true;
        break;

      case 'e': {
        po.water_opts.enhance = true;
        po.water_opts.histogram = true;
        break;
      }

      case 'n':po.water_opts.enhance_hist = true;
        break;

      case 'f': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        break;
      }

      case 'i':po.water_opts.save_intermediate = true;
        break;

      case 'r': {
        char *end;
        po.water_opts.ripple_frequency = (unsigned int) std::strtof(optarg, &end);
        po.water_opts.ripple = true;
        break;
      }

      case 'a': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        po.test = true;
        po.cuda = true;
        break;
      }

      case '?':
        if ((optopt == 'g') || (optopt == 'r')) {
          std::cerr << "Options -g and -r require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default:ProgramOptions::usage(argv);
        break;
    }
  }

  // Check if last argument is a filename.
  if (argv[argc - 1][0] != '-') {
    // File name is last argument.
    po.input_file = std::string(argv[argc - 1]);
    // Strip any path
    po.water_opts.img_name = po.input_file.substr(po.input_file.find_last_of("\\/") + 1);
    // Strip the extension
    po.water_opts.img_name = po.water_opts.img_name.substr(0, po.water_opts.img_name.find_last_of('.'));
  } else {
    ProgramOptions::usage(argv);
  }

  // Create an output directory, if it doesn't already exist.
  // This only works for cool operating systems.
  if (system("mkdir -p output") != 0) {
    throw std::runtime_error("Could not create output directory.");
  }

  // Run everything
  po.run();

  return 0;
}